

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O1

bool __thiscall
simple_thread_pool::ThreadPoolMgr::returnThread
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  element_type *peVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  int iVar5;
  __hash_code __code;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  __hashtable *__h;
  bool bVar9;
  size_t local_40;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->idleThreadsLock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  peVar1 = (t_handle->
           super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (_Hash_node_base *)peVar1->myId;
  uVar3 = (this->idleThreads)._M_h._M_bucket_count;
  uVar6 = (ulong)p_Var2 % uVar3;
  p_Var7 = (this->idleThreads)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var2 != p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar6) ||
         (p_Var8 = p_Var7, p_Var2 == p_Var4[1]._M_nxt)) goto LAB_00107fd3;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00107fd3:
  if (p_Var8 == (__node_base_ptr)0x0) {
    bVar9 = true;
  }
  else {
    bVar9 = p_Var8->_M_nxt == (_Hash_node_base *)0x0;
  }
  if (bVar9 != false) {
    local_40 = peVar1->myId;
    local_30 = (t_handle->
               super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_30->_M_use_count = local_30->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_30->_M_use_count = local_30->_M_use_count + 1;
      }
    }
    local_38 = peVar1;
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->idleThreads,&local_40);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->idleThreadsLock);
  return bVar9;
}

Assistant:

bool returnThread(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::lock_guard<std::mutex> l(idleThreadsLock);
        auto entry = idleThreads.find(t_handle->getId());
        if (entry != idleThreads.end()) {
            return false;
        }
        idleThreads.insert({t_handle->getId(), t_handle});
        return true;
    }